

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding-hash.cc
# Opt level: O3

void __thiscall
wabt::BindingHash::CreateDuplicatesVector(BindingHash *this,ValueTypeVector *out_duplicates)

{
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
  *ppVar1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
  *ppVar2;
  _Hash_node_base *__n;
  bool bVar3;
  int iVar4;
  iterator __position;
  _Hash_node_base *p_Var5;
  _Hash_node_base *p_Var6;
  bool bVar7;
  _Hash_node_base *p_Var8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
  *local_40;
  vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>
  *local_38;
  
  p_Var6 = (this->
           super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
           )._M_h._M_before_begin._M_nxt;
  p_Var8 = p_Var6->_M_nxt;
  if (p_Var8 != (_Hash_node_base *)0x0) {
    bVar7 = true;
    local_38 = (vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>
                *)out_duplicates;
    do {
      __n = p_Var6[2]._M_nxt;
      p_Var5 = p_Var8;
      bVar3 = true;
      if (__n == p_Var8[2]._M_nxt) {
        ppVar2 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
                  *)(p_Var6 + 1);
        ppVar1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
                  *)(p_Var8 + 1);
        if (__n != (_Hash_node_base *)0x0) {
          iVar4 = bcmp((ppVar2->first)._M_dataplus._M_p,(ppVar1->first)._M_dataplus._M_p,(size_t)__n
                      );
          bVar3 = true;
          if (iVar4 != 0) goto LAB_00f43760;
        }
        __position._M_current =
             *(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
               ***)(local_38 + 8);
        if (bVar7) {
          if (__position._M_current ==
              *(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
                ***)(local_38 + 0x10)) {
            local_40 = ppVar2;
            std::
            vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>
            ::_M_realloc_insert<std::pair<std::__cxx11::string_const,wabt::Binding>const*>
                      (local_38,__position,&local_40);
            __position._M_current =
                 *(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
                   ***)(local_38 + 8);
          }
          else {
            *__position._M_current = ppVar2;
            __position._M_current =
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
                  **)(*(long *)(local_38 + 8) + 8);
            *(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
              ***)(local_38 + 8) = __position._M_current;
          }
        }
        local_40 = ppVar1;
        if (__position._M_current ==
            *(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
              ***)(local_38 + 0x10)) {
          std::
          vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>
          ::_M_realloc_insert<std::pair<std::__cxx11::string_const,wabt::Binding>const*>
                    (local_38,__position,&local_40);
        }
        else {
          *__position._M_current = ppVar1;
          *(long *)(local_38 + 8) = *(long *)(local_38 + 8) + 8;
        }
        p_Var5 = p_Var6;
        bVar3 = false;
      }
LAB_00f43760:
      bVar7 = bVar3;
      p_Var8 = p_Var8->_M_nxt;
      p_Var6 = p_Var5;
    } while (p_Var8 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void BindingHash::CreateDuplicatesVector(
    ValueTypeVector* out_duplicates) const {
  // This relies on the fact that in an unordered_multimap, all values with the
  // same key are adjacent in iteration order.
  auto first = begin();
  bool is_first = true;
  for (auto iter = std::next(first); iter != end(); ++iter) {
    if (first->first == iter->first) {
      if (is_first) {
        out_duplicates->push_back(&*first);
      }
      out_duplicates->push_back(&*iter);
      is_first = false;
    } else {
      is_first = true;
      first = iter;
    }
  }
}